

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O2

double * MatInv(double *A,int row,int col)

{
  double *pdVar1;
  int i;
  ulong uVar2;
  double dVar3;
  
  dVar3 = MatDet(A,row);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    pdVar1 = MatPInv(A,row,col);
    return pdVar1;
  }
  pdVar1 = MatAdj(A,row,col);
  for (uVar2 = 0; (uint)(row * row) != uVar2; uVar2 = uVar2 + 1) {
    pdVar1[uVar2] = pdVar1[uVar2] / dVar3;
  }
  return pdVar1;
}

Assistant:

double *MatInv(double *A, int row, int col) {
    double *Out = (double *) malloc(sizeof(double) * row * col);
    double det = MatDet(A, row); //求行列式
    if (det == 0) {
        return MatPInv(A,row,col);
    }
    if (det != 0) {
        Out = MatAdj(A, row, col); //求伴随矩阵
        int len = row * row;
        for (int i = 0; i < len; i++)
            *(Out + i) /= det;
        return Out;
    }
}